

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neldermead.c
# Opt level: O1

int nel_min(custom_function *funcpt,double *xc,int N,double *dx,double fsval,int MAXITER,int *niter,
           double eps,double *xf)

{
  size_t sVar1;
  bool bVar2;
  int iVar3;
  double *__ptr;
  double *__ptr_00;
  void *__ptr_01;
  double *__ptr_02;
  double *__src;
  double *__ptr_03;
  void *__dest;
  double *__dest_00;
  double *__dest_01;
  ulong uVar4;
  double *pdVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  double *pdVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  int local_44;
  
  uVar8 = (ulong)(uint)N;
  uVar13 = (ulong)(N + 1U);
  lVar11 = (long)N;
  *niter = 0;
  sVar1 = lVar11 * 8;
  __ptr = (double *)malloc((lVar11 + 1) * sVar1);
  __ptr_00 = (double *)malloc(lVar11 * 8 + 8);
  __ptr_01 = malloc(sVar1);
  __ptr_02 = (double *)malloc(sVar1);
  __src = (double *)malloc(sVar1);
  __ptr_03 = (double *)malloc(sVar1);
  __dest = malloc(sVar1);
  __dest_00 = (double *)malloc(sVar1);
  __dest_01 = (double *)malloc(sVar1);
  if (0 < N) {
    memcpy(__dest_00,xc,uVar8 * 8);
  }
  sVar1 = uVar8 * 8;
  dVar19 = 1.0;
  dVar17 = 1.0;
  uVar7 = N * N;
  do {
    if (MAXITER <= *niter) break;
    if (0 < N) {
      memcpy(__ptr + (int)uVar7,__dest_00,sVar1);
    }
    dVar14 = (*funcpt->funcpt)(__dest_00,N,funcpt->params);
    __ptr_00[lVar11] = dVar14;
    if (0 < N) {
      uVar9 = 0;
      pdVar5 = __ptr;
      do {
        __dest_00[uVar9] = dx[uVar9] * dVar17 + __dest_00[uVar9];
        memcpy(pdVar5,__dest_00,sVar1);
        dVar14 = (*funcpt->funcpt)(__dest_00,N,funcpt->params);
        __ptr_00[uVar9] = dVar14;
        __dest_00[uVar9] = __dest_00[uVar9] - dx[uVar9] * dVar17;
        uVar9 = uVar9 + 1;
        pdVar5 = pdVar5 + uVar8;
      } while (uVar8 != uVar9);
    }
    dVar14 = *__ptr_00;
    uVar9 = 0;
    local_44 = 0;
    if (0 < N) {
      uVar4 = 1;
      do {
        if (__ptr_00[uVar4] < dVar14) {
          uVar9 = uVar4 & 0xffffffff;
          dVar14 = __ptr_00[uVar4];
        }
        local_44 = (int)uVar9;
        uVar4 = uVar4 + 1;
      } while (uVar13 != uVar4);
    }
    if (0 < N) {
      memcpy(__dest,__ptr + local_44 * N,sVar1);
    }
    bVar2 = false;
    if ((eps < ABS(dVar19)) && (iVar3 = *niter, bVar2 = false, iVar3 < MAXITER)) {
      bVar2 = false;
      do {
        *niter = iVar3 + 1;
        iVar3 = 0;
        if (0 < N) {
          dVar19 = *__ptr_00;
          uVar4 = 0;
          uVar9 = 1;
          do {
            dVar15 = __ptr_00[uVar9];
            if (dVar19 < dVar15) {
              uVar4 = uVar9 & 0xffffffff;
            }
            iVar3 = (int)uVar4;
            if (dVar15 <= dVar19) {
              dVar15 = dVar19;
            }
            dVar19 = dVar15;
            uVar9 = uVar9 + 1;
          } while (uVar13 != uVar9);
        }
        if (0 < N) {
          uVar9 = 0;
          pdVar5 = __ptr;
          do {
            dVar19 = 0.0;
            uVar4 = uVar13;
            pdVar10 = pdVar5;
            do {
              dVar19 = dVar19 + *pdVar10;
              pdVar10 = pdVar10 + uVar8;
              uVar4 = uVar4 - 1;
            } while (uVar4 != 0);
            *(double *)((long)__ptr_01 + uVar9 * 8) =
                 (dVar19 - __ptr[(long)(iVar3 * N) + uVar9]) / (double)N;
            uVar9 = uVar9 + 1;
            pdVar5 = pdVar5 + 1;
          } while (uVar9 != uVar8);
        }
        iVar6 = iVar3 * N;
        if (0 < N) {
          uVar9 = 0;
          do {
            dVar19 = *(double *)((long)__ptr_01 + uVar9 * 8);
            __ptr_02[uVar9] = (dVar19 + dVar19) - __ptr[(long)iVar6 + uVar9];
            uVar9 = uVar9 + 1;
          } while (uVar8 != uVar9);
        }
        dVar19 = (*funcpt->funcpt)(__ptr_02,N,funcpt->params);
        pdVar5 = __ptr_02;
        if (dVar14 <= dVar19) {
          if (N < 0) {
            uVar7 = 0;
          }
          else {
            uVar9 = 0;
            uVar7 = 0;
            do {
              uVar7 = uVar7 + (dVar19 < __ptr_00[uVar9]);
              uVar9 = uVar9 + 1;
            } while (uVar13 != uVar9);
          }
          iVar12 = iVar6;
          if (uVar7 == 0) {
            if (0 < N) {
              uVar9 = 0;
              do {
                __src[uVar9] = __ptr[(long)iVar6 + uVar9] * 0.5 +
                               *(double *)((long)__ptr_01 + uVar9 * 8) * 0.5;
                uVar9 = uVar9 + 1;
              } while (uVar8 != uVar9);
            }
            dVar15 = (*funcpt->funcpt)(__src,N,funcpt->params);
            if (dVar15 <= __ptr_00[iVar3]) {
              if (0 < N) {
                memcpy(__ptr + iVar6,__src,sVar1);
              }
              __ptr_00[iVar3] = dVar15;
            }
            else {
              if (-1 < N) {
                uVar9 = 0;
                pdVar10 = __ptr;
                do {
                  if (0 < N) {
                    uVar4 = 0;
                    do {
                      dVar14 = (pdVar10[uVar4] + *(double *)((long)__dest + uVar4 * 8)) * 0.5;
                      pdVar10[uVar4] = dVar14;
                      __ptr_03[uVar4] = dVar14;
                      uVar4 = uVar4 + 1;
                    } while (uVar8 != uVar4);
                  }
                  dVar14 = (*funcpt->funcpt)(__ptr_03,N,funcpt->params);
                  __ptr_00[uVar9] = dVar14;
                  uVar9 = uVar9 + 1;
                  pdVar10 = pdVar10 + uVar8;
                } while (uVar9 != uVar13);
              }
              dVar14 = *__ptr_00;
              uVar9 = 0;
              local_44 = 0;
              if (0 < N) {
                uVar4 = 1;
                do {
                  dVar15 = __ptr_00[uVar4];
                  if (dVar15 < dVar14) {
                    uVar9 = uVar4 & 0xffffffff;
                  }
                  local_44 = (int)uVar9;
                  if (dVar14 <= dVar15) {
                    dVar15 = dVar14;
                  }
                  dVar14 = dVar15;
                  uVar4 = uVar4 + 1;
                } while (uVar13 != uVar4);
              }
              iVar12 = local_44 * N;
              if (0 < N) {
                memcpy(__dest,__ptr + iVar12,sVar1);
              }
            }
          }
          if (uVar7 == 1) {
            if (0 < N) {
              uVar9 = 0;
              do {
                __src[uVar9] = __ptr[(long)iVar12 + uVar9] * 0.5 +
                               *(double *)((long)__ptr_01 + uVar9 * 8) * 0.5;
                uVar9 = uVar9 + 1;
              } while (uVar8 != uVar9);
            }
            dVar15 = (*funcpt->funcpt)(__src,N,funcpt->params);
            pdVar10 = __src;
            if (dVar19 < dVar15) {
              pdVar10 = __ptr_02;
              dVar15 = dVar19;
            }
            if (0 < N) {
              memcpy(__ptr + iVar6,pdVar10,sVar1);
            }
            __ptr_00[iVar3] = dVar15;
          }
          if (1 < uVar7) goto joined_r0x00143938;
        }
        else {
          if (0 < N) {
            uVar9 = 0;
            do {
              __src[uVar9] = (__ptr_02[uVar9] + __ptr_02[uVar9]) -
                             *(double *)((long)__ptr_01 + uVar9 * 8);
              uVar9 = uVar9 + 1;
            } while (uVar8 != uVar9);
          }
          dVar15 = (*funcpt->funcpt)(__src,N,funcpt->params);
          if (dVar15 < dVar19) {
            pdVar5 = __src;
            dVar19 = dVar15;
          }
joined_r0x00143938:
          if (0 < N) {
            memcpy(__ptr + iVar6,pdVar5,sVar1);
          }
          __ptr_00[iVar3] = dVar19;
        }
        dVar15 = __ptr_00[iVar3];
        if (dVar15 < dVar14) {
          local_44 = iVar3;
        }
        dVar19 = 0.0;
        dVar16 = 0.0;
        if (-1 < N) {
          uVar9 = 0;
          do {
            dVar16 = dVar16 + __ptr_00[uVar9];
            uVar9 = uVar9 + 1;
          } while (uVar13 != uVar9);
        }
        if (-1 < N) {
          dVar19 = 0.0;
          uVar9 = 0;
          do {
            dVar18 = __ptr_00[uVar9] - dVar16 / (double)(int)(N + 1U);
            dVar19 = dVar19 + dVar18 * dVar18;
            uVar9 = uVar9 + 1;
          } while (uVar13 != uVar9);
        }
        if (dVar19 < 0.0) {
          dVar19 = sqrt(dVar19);
        }
        else {
          dVar19 = SQRT(dVar19);
        }
        if (ABS(dVar19) < eps) {
          bVar2 = true;
        }
        if (ABS(dVar19) <= eps) break;
        if (dVar14 <= dVar15) {
          dVar15 = dVar14;
        }
        dVar14 = dVar15;
        iVar3 = *niter;
      } while (iVar3 < MAXITER);
    }
    uVar7 = local_44 * N;
    if (0 < N) {
      memcpy(__dest_01,__ptr + (int)uVar7,sVar1);
      dVar14 = __ptr_00[local_44];
      uVar9 = 0;
      do {
        dVar17 = dx[uVar9] * 0.001;
        __dest_01[uVar9] = __dest_01[uVar9] + dVar17;
        dVar15 = (*funcpt->funcpt)(__dest_01,N,funcpt->params);
        bVar2 = false;
        if (dVar15 < dVar14) goto LAB_00143b89;
        __dest_01[uVar9] = __dest_01[uVar9] - (dVar17 + dVar17);
        dVar15 = (*funcpt->funcpt)(__dest_01,N,funcpt->params);
        if (dVar15 < dVar14) {
          bVar2 = false;
          goto LAB_00143b89;
        }
        uVar9 = uVar9 + 1;
      } while (uVar8 != uVar9);
      bVar2 = true;
    }
LAB_00143b89:
    if (!bVar2) {
      dVar17 = 0.001;
      dVar19 = 1.0;
    }
    if (!bVar2 && 0 < N) {
      memcpy(__dest_00,__dest_01,sVar1);
      dVar17 = 0.001;
      dVar19 = 1.0;
    }
  } while (!bVar2);
  if (0 < N) {
    memcpy(xf,__ptr + (uint)(N * N),sVar1);
  }
  iVar3 = *niter;
  free(__ptr_00);
  free(__ptr);
  free(__ptr_01);
  free(__ptr_02);
  free(__src);
  free(__ptr_03);
  free(__dest);
  free(__dest_00);
  free(__dest_01);
  return (uint)(MAXITER <= iVar3) * 3 + 1;
}

Assistant:

int nel_min(custom_function *funcpt,double *xc,int N,double *dx,double fsval,int MAXITER,int *niter,
		double eps,double *xf) {
	int rcode,NN,i,j,ct,ctl;
	int ihi,ilo,L,siter;
	double reqmin,rcoeff,ecoeff,ccoeff,fn,del;
	double ylo,ynl,temp,ys,yss;
	double *P,*Y,*PB,*PS,*PSS,*PM,*PL,*xi,*xmin;
	double ysum,yavg,s,dval;

	rcode = 0;
	reqmin = eps;
	rcoeff = 1.0;
	ecoeff = 2.0;
	ccoeff = 0.5;
	del = 1.0;
	NN = N + 1;
	ct = N * N;
	*niter = 0;
	siter = MAXITER;
	s = 1.0;
	ctl = 0;
	dval = 1.0e-03;

	P = (double*) malloc(sizeof(double) * N * NN);
	Y = (double*) malloc(sizeof(double) * NN);
	PB = (double*) malloc(sizeof(double) * N);
	PS = (double*) malloc(sizeof(double) * N);
	PSS = (double*) malloc(sizeof(double) * N);
	PM = (double*) malloc(sizeof(double) * N);
	PL = (double*) malloc(sizeof(double) * N);
	xi = (double*) malloc(sizeof(double) * N);
	xmin = (double*) malloc(sizeof(double) * N);

	for (i = 0; i < N;++i) {
		xi[i] = xc[i];
	}

	while (ctl == 0 && *niter < siter) {
		// Create N+1 point Simplex
		for (i = 0; i < N;++i) {
			P[ct + i] = xi[i];
		}

		fn = FUNCPT_EVAL(funcpt,xi,N);
		Y[N] = fn;


		for (i = 0; i < N;++i) {
			xi[i] += dx[i] * del;
			ct = i * N;
			for (j = 0; j < N;++j) {
				P[ct + j] = xi[j];
			}
			fn = FUNCPT_EVAL(funcpt, xi, N);
			Y[i] = fn;
			xi[i] -= dx[i] * del;
		}

		ylo = Y[0];
		ilo = 0;

		for (i = 1; i < NN;++i) {

			if (Y[i] < ylo) {
				ylo = Y[i];
				ilo = i;
			}
		}

		ct = ilo * N;

		for (i = 0; i < N;++i) {
			PL[i] = P[ct + i];
		}


		while (fabs(s) > reqmin && *niter < siter) {
			*niter = *niter + 1;

			// Find highest and lowest function values.

			ynl = Y[0];
			ihi = 0;

			for (i = 1; i < NN;++i) {

				if (Y[i] > ynl) {
					ynl = Y[i];
					ihi = i;
				}

			}


			// Find PB [Centroid]
			ct = N;
			for(i = 0; i < N;i++) {
				temp = 0.0;
				for ( j = 0; j < NN;++j) {
					temp += P[j*ct+i];
				}
				temp -= P[ihi*ct+i];
				PB[i] = temp / (double) N;
			}

			// Find reflection
			ct = ihi * N;
			for (i = 0; i < N;++i) {
				PS[i] = (1.0 + rcoeff) * PB[i] - rcoeff * P[ct+i];
			}
			ys = FUNCPT_EVAL(funcpt, PS, N);

			if (ys < ylo) {
				for (i = 0; i < N;++i) {
					PSS[i] = ecoeff * PS[i] + (1.0 - ecoeff) * PB[i];
				}
				yss = FUNCPT_EVAL(funcpt, PSS, N);

				if (yss < ys) {
					for(i = 0; i < N;++i) {
						P[ct + i] = PSS[i];
					}
					Y[ihi] = yss;
				} else {
					for(i = 0; i < N;++i) {
						P[ct + i] = PS[i];
					}
					Y[ihi] = ys;
				}


			} else {
				L = 0;
				for (i = 0; i < NN;++i) {
					if (Y[i] > ys) {
						L++;
					}
				}
	/*
				if (L == 1) {
					for ( i = 0; i < N;++i) {
						P[ct + i] = PS[i];
					}
					Y[ihi] = ys;
				}*/
				if (L == 0) {
					for (i = 0; i < N;++i) {
						PSS[i] = ccoeff * P[ct + i] + (1.0 - ccoeff) * PB[i];
					}
					yss = FUNCPT_EVAL(funcpt, PSS, N);

					if (yss <= Y[ihi]) {
						for(i = 0; i < N;++i) {
							P[ct + i] = PSS[i];
						}
						Y[ihi] = yss;

					} else {

						//ctl = ilo * N;
						for(i = 0; i < NN;++i) {
							ct = i * N;
							for (j = 0;j < N;++j) {
								P[ct + j] = 0.5 * (P[ct + j] + PL[j]);
								PM[j] = P[ct + j];
							}
							Y[i] = FUNCPT_EVAL(funcpt, PM, N);

						}
						ylo = Y[0];
						ilo = 0;

						for (i = 1; i < NN;++i) {

							if (Y[i] < ylo) {
								ylo = Y[i];
								ilo = i;
							}

						}
						ct = ilo * N;

						for (i = 0; i < N;++i) {
							PL[i] = P[ct + i];
						}
					}
				}
				if (L == 1) {
					for (i = 0; i < N;++i) {
						PSS[i] = ccoeff * P[ct + i] + (1.0 - ccoeff) * PB[i];
					}
					yss = FUNCPT_EVAL(funcpt, PSS, N);

					if (yss <= ys) {
						ct = ihi * N;
						for(i = 0; i < N;++i) {
							P[ct + i] = PSS[i];
						}
						Y[ihi] = yss;

					} else {
						ct = ihi * N;
						for(i = 0; i < N;++i) {
							P[ct + i] = PS[i];
						}
						Y[ihi] = ys;

					}

				}


				if (L > 1) {
					ct = ihi * N;
					for(i = 0; i < N;++i) {
						P[ct + i] = PS[i];
					}
					Y[ihi] = ys;

				}
			}

			if (Y[ihi] < ylo) {
				ylo = Y[ihi];
				ilo = ihi;
			}

			//To the end of the loop
			ysum = 0.0;
			for (j=0 ;j <= N;j++) {
				ysum += Y[j];
			}
			yavg = ysum/(N+1);
			s = 0.0;
			for (j=0;j<=N;j++) {
				s += pow((Y[j]-yavg),2.0);
			}
			s = sqrt(s);//Remove this statement if you want convergence in fewer iterations
			if (fabs(s) < reqmin) {
				ctl = 1;
			}

		}
		ct = ilo * N;
		for(i = 0; i < N;++i) {
			xmin[i] = P[ct + i];
		}
		ynl = Y[ilo];

		for (i = 0; i < N;++i) {
			del = dx[i] * dval;
			xmin[i] += del;
			fn = FUNCPT_EVAL(funcpt, xmin, N);
			if (fn < ynl) {
				ctl = 0;
				break;
			} else {
				ctl++;
			}
			xmin[i] = xmin[i] - 2 * del;
			fn = FUNCPT_EVAL(funcpt, xmin, N);
			if (fn < ynl) {
				ctl = 0;
				break;
			} else {
				ctl++;
			}
		}

		if (ctl == 0) {
			for (i = 0; i < N;++i) {
				xi[i] = xmin[i];
			}
			del = dval;
			s = 1.0;
		}

	}

	ct = N * N;
	for (i = 0; i < N;++i) {
		xf[i] = P[ct + i];
	}

	if (rcode == 0 && *niter >= siter) {
		rcode = 4;
	} else if (*niter < siter) {
		rcode = 1;
	}


	free(Y);
	free(P);
	free(PB);
	free(PS);
	free(PSS);
	free(PM);
	free(PL);
	free(xi);
	free(xmin);
	return rcode;
}